

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20.c
# Opt level: O2

void chacha20_encrypt_block(uint32_t *ctx,uint8_t *out,uint32_t incr,uint8_t *text)

{
  undefined8 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint32_t *os;
  uint8_t *bj;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int iStack_34;
  undefined8 uStack_30;
  
  local_68 = *(undefined8 *)ctx;
  uStack_60 = *(undefined8 *)(ctx + 2);
  local_58 = *(undefined8 *)(ctx + 4);
  uStack_50 = *(undefined8 *)(ctx + 6);
  local_48 = *(undefined8 *)(ctx + 8);
  uStack_40 = *(undefined8 *)(ctx + 10);
  uStack_30 = *(undefined8 *)(ctx + 0xe);
  local_38 = (int)*(undefined8 *)(ctx + 0xc);
  local_38 = local_38 + incr;
  iStack_34 = (int)((ulong)*(undefined8 *)(ctx + 0xc) >> 0x20);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  double_round((uint32_t *)&local_68);
  uVar2 = ctx[0xc];
  uVar1 = *(undefined8 *)(ctx + 0xe);
  uVar4 = ctx[1];
  uVar5 = ctx[2];
  uVar6 = ctx[3];
  uVar7 = ctx[4];
  uVar8 = ctx[5];
  uVar9 = ctx[6];
  uVar10 = ctx[7];
  uVar11 = ctx[8];
  uVar12 = ctx[9];
  uVar13 = ctx[10];
  uVar14 = ctx[0xb];
  uVar27 = *(uint *)(text + 4);
  uVar28 = *(uint *)(text + 8);
  uVar29 = *(uint *)(text + 0xc);
  uVar15 = *(uint *)(text + 0x10);
  uVar16 = *(uint *)(text + 0x14);
  uVar17 = *(uint *)(text + 0x18);
  uVar18 = *(uint *)(text + 0x1c);
  uVar19 = *(uint *)(text + 0x20);
  uVar20 = *(uint *)(text + 0x24);
  uVar21 = *(uint *)(text + 0x28);
  uVar22 = *(uint *)(text + 0x2c);
  uVar23 = *(uint *)(text + 0x30);
  uVar24 = *(uint *)(text + 0x34);
  uVar25 = *(uint *)(text + 0x38);
  uVar26 = *(uint *)(text + 0x3c);
  uVar3 = ctx[0xd];
  *(uint *)out = *(uint *)text ^ *ctx + (uint32_t)local_68;
  *(uint *)(out + 4) = uVar27 ^ uVar4 + local_68._4_4_;
  *(uint *)(out + 8) = uVar28 ^ uVar5 + (int)uStack_60;
  *(uint *)(out + 0xc) = uVar29 ^ uVar6 + uStack_60._4_4_;
  *(uint32_t *)(out + 0x10) = uVar7 + (int)local_58 ^ uVar15;
  *(uint32_t *)(out + 0x14) = uVar8 + local_58._4_4_ ^ uVar16;
  *(uint32_t *)(out + 0x18) = uVar9 + (int)uStack_50 ^ uVar17;
  *(uint32_t *)(out + 0x1c) = uVar10 + uStack_50._4_4_ ^ uVar18;
  *(uint32_t *)(out + 0x20) = uVar11 + (int)local_48 ^ uVar19;
  *(uint32_t *)(out + 0x24) = uVar12 + local_48._4_4_ ^ uVar20;
  *(uint32_t *)(out + 0x28) = uVar13 + (int)uStack_40 ^ uVar21;
  *(uint32_t *)(out + 0x2c) = uVar14 + uStack_40._4_4_ ^ uVar22;
  *(uint32_t *)(out + 0x30) = incr + uVar2 + local_38 ^ uVar23;
  *(uint32_t *)(out + 0x34) = iStack_34 + uVar3 ^ uVar24;
  *(uint *)(out + 0x38) = (int)uStack_30 + (int)uVar1 ^ uVar25;
  *(uint *)(out + 0x3c) = (int)((ulong)uStack_30 >> 0x20) + (int)((ulong)uVar1 >> 0x20) ^ uVar26;
  return;
}

Assistant:

static void chacha20_encrypt_block(uint32_t *ctx, uint8_t *out, uint32_t incr, uint8_t *text)
{
  uint32_t k[16U] = { 0U };
  chacha20_core(k, ctx, incr);
  uint32_t bl[16U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint32_t *os = bl;
    uint8_t *bj = text + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint32_t *os = bl;
    uint32_t x = bl[i] ^ k[i];
    os[i] = x;);
  KRML_MAYBE_FOR16(i, 0U, 16U, 1U, store32_le(out + i * 4U, bl[i]););
}